

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizesMultipleCaches_Test::
TEST_TestMemoryAccountant_reportWithCacheSizesMultipleCaches_Test
          (TEST_TestMemoryAccountant_reportWithCacheSizesMultipleCaches_Test *this)

{
  TEST_TestMemoryAccountant_reportWithCacheSizesMultipleCaches_Test *this_local;
  
  memset(this,0,0x68);
  TEST_GROUP_CppUTestGroupTestMemoryAccountant::TEST_GROUP_CppUTestGroupTestMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant);
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_TestMemoryAccountant_reportWithCacheSizesMultipleCaches_Test_0040cc08;
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizesMultipleCaches)
{
    size_t cacheSizes[] = {4, 10, 20};

    accountant.useCacheSizes(cacheSizes, 3);
    accountant.alloc(8);
    accountant.alloc(12);
    accountant.alloc(20);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "   10                   1                0                 1\n"
                 "   20                   2                0                 2\n"
                 "other                   0                0                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}